

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmSourceFile * __thiscall
cmMakefile::AddCustomCommandToOutput
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,string *main_dependency,cmCustomCommandLines *commandLines,char *comment,
          char *workingDir,bool replace,bool escapeOldStyle,bool uses_terminal,
          bool command_expand_lists,string *depfile,string *job_pool)

{
  cmCustomCommandLine *__first1;
  cmCustomCommandLine *__last1;
  cmCustomCommandLine *__first2;
  string *psVar1;
  pointer pbVar2;
  bool bVar3;
  cmSourceFile *pcVar4;
  cmCustomCommand *pcVar5;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar6;
  ostream *poVar7;
  cmCustomCommandLines *pcVar8;
  long *plVar9;
  size_type *psVar10;
  string *o;
  string *psVar11;
  pointer pbVar12;
  string *o_1;
  pointer pcVar13;
  string local_278;
  cmSourceFile *local_258;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_240;
  string *local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_240 = byproducts;
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    _e = (pointer)local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&e,"Attempt to add a custom rule with no output!","");
    cmSystemTools::Error((string *)&e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_e != local_198) {
      operator_delete(_e,local_198[0]._M_allocated_capacity + 1);
    }
    return (cmSourceFile *)0x0;
  }
  for (pcVar13 = (commandLines->
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar3 = pcVar13 !=
              (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              ).super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
              _M_impl.super__Vector_impl_data._M_finish,
      local_250 = &commandLines->
                   super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
      local_230 = depends, bVar3; pcVar13 = pcVar13 + 1) {
    pbVar12 = (pcVar13->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((pbVar12 !=
          (pcVar13->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) && (pbVar12->_M_string_length != 0)) &&
       (*(pbVar12->_M_dataplus)._M_p == '\"')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&e,"COMMAND may not contain literal quotes:\n  ",0x2a);
      pbVar12 = (pcVar13->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&e,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_278);
      commandLines = (cmCustomCommandLines *)local_250;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::ios_base::~ios_base(local_138);
      if (bVar3) {
        return (cmSourceFile *)0x0;
      }
      break;
    }
  }
  pcVar4 = (cmSourceFile *)0x0;
  if (((commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_finish) && (main_dependency->_M_string_length != 0)) {
    pcVar4 = GetSource(this,main_dependency,Ambiguous);
    if (pcVar4 == (cmSourceFile *)0x0) {
      pcVar4 = CreateSource(this,main_dependency,false,Ambiguous);
    }
    else {
      pcVar5 = cmSourceFile::GetCustomCommand(pcVar4);
      if (pcVar5 != (cmCustomCommand *)0x0 && !replace) {
        pcVar5 = cmSourceFile::GetCustomCommand(pcVar4);
        pvVar6 = &cmCustomCommand::GetCommandLines(pcVar5)->
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
        bVar3 = std::operator==(&commandLines->
                                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                ,pvVar6);
        if (bVar3) {
          return pcVar4;
        }
        pcVar4 = (cmSourceFile *)0x0;
      }
    }
  }
  local_258 = pcVar4;
  if (pcVar4 != (cmSourceFile *)0x0) goto LAB_0017f470;
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2b])
            ((string *)&e,this->GlobalGenerator,
             (outputs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  pcVar4 = GetSource(this,(string *)&e,Known);
  pvVar6 = local_250;
  if (pcVar4 == (cmSourceFile *)0x0) {
    pcVar4 = CreateSource(this,(string *)&e,true,Known);
LAB_0017f39c:
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"__CMAKE_RULE","");
    cmSourceFile::SetProperty(pcVar4,&local_278,"1");
    local_258 = pcVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    bVar3 = true;
    pcVar4 = (cmSourceFile *)0x0;
  }
  else {
    pcVar5 = cmSourceFile::GetCustomCommand(pcVar4);
    if (pcVar5 == (cmCustomCommand *)0x0 || replace) goto LAB_0017f39c;
    pcVar5 = cmSourceFile::GetCustomCommand(pcVar4);
    pcVar8 = cmCustomCommand::GetCommandLines(pcVar5);
    __first1 = (pvVar6->
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               _M_impl.super__Vector_impl_data._M_start;
    __last1 = (pvVar6->super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_258 = pcVar4;
    if (((long)__last1 - (long)__first1 !=
         (long)(pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)__first2) ||
       (bVar3 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                          (__first1,__last1,__first2), !bVar3)) {
      std::operator+(&local_228,"Attempt to add a custom rule to output \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_228);
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_278.field_2._M_allocated_capacity = *psVar10;
        local_278.field_2._8_8_ = plVar9[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar10;
        local_278._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_278._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      cmSystemTools::Error(&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
    }
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != local_198) {
    operator_delete(_e,local_198[0]._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    return pcVar4;
  }
LAB_0017f470:
  psVar11 = (outputs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (outputs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_248 = outputs;
  local_238 = main_dependency;
  if (psVar11 != psVar1) {
    do {
      pcVar4 = GetOrCreateSource(this,psVar11,true,Known);
      if (pcVar4 != (cmSourceFile *)0x0) {
        _e = (pointer)local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)&e,"GENERATED","");
        cmSourceFile::SetProperty(pcVar4,(string *)&e,"1");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_198) {
          operator_delete(_e,local_198[0]._M_allocated_capacity + 1);
        }
      }
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar1);
  }
  pbVar12 = (local_240->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (local_240->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 != pbVar2) {
    do {
      pcVar4 = GetOrCreateSource(this,pbVar12,true,Known);
      if (pcVar4 != (cmSourceFile *)0x0) {
        _e = (pointer)local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)&e,"GENERATED","");
        cmSourceFile::SetProperty(pcVar4,(string *)&e,"1");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_198) {
          operator_delete(_e,local_198[0]._M_allocated_capacity + 1);
        }
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar2);
  }
  pcVar4 = local_258;
  if (local_258 != (cmSourceFile *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&e,local_230);
    if (local_238->_M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&e,local_238);
    }
    pcVar5 = (cmCustomCommand *)operator_new(0x110);
    pvVar6 = local_250;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,local_248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1d8,local_240);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1f0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&e);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_208,pvVar6);
    cmCustomCommand::cmCustomCommand
              (pcVar5,this,&local_1c0,&local_1d8,&local_1f0,(cmCustomCommandLines *)&local_208,
               comment,workingDir);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
    cmCustomCommand::SetEscapeOldStyle(pcVar5,escapeOldStyle);
    cmCustomCommand::SetEscapeAllowMakeVars(pcVar5,true);
    cmCustomCommand::SetUsesTerminal(pcVar5,uses_terminal);
    cmCustomCommand::SetCommandExpandLists(pcVar5,command_expand_lists);
    cmCustomCommand::SetDepfile(pcVar5,depfile);
    cmCustomCommand::SetJobPool(pcVar5,job_pool);
    cmSourceFile::SetCustomCommand(pcVar4,pcVar5);
    psVar1 = (local_248->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar11 = (local_248->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar1;
        psVar11 = psVar11 + 1) {
      UpdateOutputToSourceMap(this,psVar11,pcVar4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&e);
  }
  return pcVar4;
}

Assistant:

cmSourceFile* cmMakefile::AddCustomCommandToOutput(
  const std::vector<std::string>& outputs,
  const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends, const std::string& main_dependency,
  const cmCustomCommandLines& commandLines, const char* comment,
  const char* workingDir, bool replace, bool escapeOldStyle,
  bool uses_terminal, bool command_expand_lists, const std::string& depfile,
  const std::string& job_pool)
{
  // Make sure there is at least one output.
  if (outputs.empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return nullptr;
  }

  // Validate custom commands.  TODO: More strict?
  for (cmCustomCommandLine const& cl : commandLines) {
    if (!cl.empty() && !cl[0].empty() && cl[0][0] == '"') {
      std::ostringstream e;
      e << "COMMAND may not contain literal quotes:\n  " << cl[0] << "\n";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return nullptr;
    }
  }

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = nullptr;
  if (!commandLines.empty() && !main_dependency.empty()) {
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = this->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = nullptr;
    } else if (!file) {
      file = this->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = this->GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(outputs[0]);

    // Check if the rule file already exists.
    file = this->GetSource(outName, cmSourceFileLocationKind::Known);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        cmSystemTools::Error("Attempt to add a custom rule to output \"" +
                             outName + "\" which already has a custom rule.");
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file =
        this->CreateSource(outName, true, cmSourceFileLocationKind::Known);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Always create the output sources and mark them generated.
  for (std::string const& o : outputs) {
    if (cmSourceFile* out =
          this->GetOrCreateSource(o, true, cmSourceFileLocationKind::Known)) {
      out->SetProperty("GENERATED", "1");
    }
  }
  for (std::string const& o : byproducts) {
    if (cmSourceFile* out =
          this->GetOrCreateSource(o, true, cmSourceFileLocationKind::Known)) {
      out->SetProperty("GENERATED", "1");
    }
  }

  // Attach the custom command to the file.
  if (file) {
    // Construct a complete list of dependencies.
    std::vector<std::string> depends2(depends);
    if (!main_dependency.empty()) {
      depends2.push_back(main_dependency);
    }

    cmCustomCommand* cc = new cmCustomCommand(
      this, outputs, byproducts, depends2, commandLines, comment, workingDir);
    cc->SetEscapeOldStyle(escapeOldStyle);
    cc->SetEscapeAllowMakeVars(true);
    cc->SetUsesTerminal(uses_terminal);
    cc->SetCommandExpandLists(command_expand_lists);
    cc->SetDepfile(depfile);
    cc->SetJobPool(job_pool);
    file->SetCustomCommand(cc);
    this->UpdateOutputToSourceMap(outputs, file);
  }
  return file;
}